

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

bool __thiscall
clipp::parser::try_match_full<clipp::detail::select_values>
          (parser *this,arg_string *arg,select_values *select)

{
  match_t match;
  match_t local_180;
  scoped_dfs_traverser local_c0;
  
  detail::scoped_dfs_traverser::scoped_dfs_traverser(&local_c0,&this->pos_);
  detail::full_match<clipp::detail::select_values>(&local_180,&local_c0,arg,select);
  detail::scoped_dfs_traverser::~scoped_dfs_traverser(&local_c0);
  if (local_180.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_180.pos_.pos_.stack_.
      super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    add_match(this,&local_180);
  }
  detail::match_t::~match_t(&local_180);
  return local_180.pos_.pos_.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_180.pos_.pos_.stack_.
         super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
         ._M_impl.super__Vector_impl_data._M_finish;
}

Assistant:

bool try_match_full(const arg_string& arg, const ParamSelector& select)
    {
        auto match = detail::full_match(pos_, arg, select);
        if(!match) return false;
        add_match(match);
        return true;
    }